

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall tinyusdz::crate::CrateReader::ReadTimeSamples(CrateReader *this,TimeSamples *d)

{
  StreamReader *pSVar1;
  ulong uVar2;
  bool bVar3;
  value_type *__x;
  ostream *poVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char *pcVar6;
  uint64_t uVar7;
  int64_t offset;
  vector<double,_std::allocator<double>_> times;
  ValueRep times_rep;
  uint64_t num_values;
  ValueRep rep;
  ostringstream ss_e;
  allocator local_281;
  int64_t local_280;
  bool local_278 [8];
  undefined1 local_270 [24];
  string *local_258;
  uint64_t local_250;
  _Vector_base<double,_std::allocator<double>_> local_248;
  storage_union local_228;
  undefined **local_218;
  ValueRep local_208;
  storage_union local_200;
  undefined **local_1f0;
  uint64_t local_1e8 [4];
  string local_1c8;
  optional<std::vector<double,_std::allocator<double>_>_> local_1a8 [11];
  
  local_280 = 0;
  bVar3 = StreamReader::read8(this->_sr,&local_280);
  if (!bVar3) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar4 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,"[Crate]");
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ReadTimeSamples");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x333);
    ::std::operator<<(poVar4," ");
    pcVar6 = "Failed to read the offset for value in Dictionary.";
LAB_0016f336:
    poVar4 = ::std::operator<<((ostream *)local_1a8,pcVar6);
    ::std::operator<<(poVar4,"\n");
LAB_0016f42b:
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    return false;
  }
  pSVar1 = this->_sr;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((local_280 + pSVar1->idx_) - 8);
  if (((long)args < 0) ||
     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar1->length_ < args))
  {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar4 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,"[Crate]");
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ReadTimeSamples");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x33d);
    ::std::operator<<(poVar4," ");
    ::std::__cxx11::to_string((string *)&local_228,local_280);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                     "Failed to seek to TimeSample times. Invalid offset value: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228
                    );
    poVar4 = ::std::operator<<((ostream *)local_1a8,(string *)local_278);
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    goto LAB_0016f42b;
  }
  pSVar1->idx_ = (uint64_t)args;
  local_208.data = 0;
  bVar3 = ReadValueRep(this,&local_208);
  if (!bVar3) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar4 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,"[Crate]");
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ReadTimeSamples");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x344);
    ::std::operator<<(poVar4," ");
    pcVar6 = "Failed to read ValueRep for TimeSample\' `times` element.";
    goto LAB_0016f336;
  }
  uVar7 = this->_sr->idx_;
  local_1f0 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_200.dynamic = (void *)0x0;
  bVar3 = UnpackValueRep(this,&local_208,(CrateValue *)&local_200);
  if (!bVar3) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar4 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,"[Crate]");
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ReadTimeSamples");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x357);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)local_1a8,
                               "Failed to unpack value of TimeSample\'s `times` element.");
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    bVar3 = false;
    goto LAB_0016faee;
  }
  local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CrateValue::get_value<std::vector<double,std::allocator<double>>>
            (local_1a8,(CrateValue *)&local_200);
  local_278[0] = local_1a8[0].has_value_;
  if (local_1a8[0].has_value_ == true) {
    local_270._0_8_ = local_1a8[0].contained.data.__align;
    local_270._8_8_ = local_1a8[0].contained._8_8_;
    local_270._16_8_ = local_1a8[0].contained._16_8_;
    local_1a8[0].contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_1a8[0].contained._8_8_ = 0;
    local_1a8[0].contained._16_8_ = 0;
  }
  nonstd::optional_lite::optional<std::vector<double,_std::allocator<double>_>_>::~optional
            (local_1a8);
  bVar3 = local_278[0];
  if (local_278[0] == true) {
    __x = nonstd::optional_lite::optional<std::vector<double,_std::allocator<double>_>_>::value
                    ((optional<std::vector<double,_std::allocator<double>_>_> *)local_278);
    ::std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)&local_248,__x);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar4 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,"[Crate]");
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ReadTimeSamples");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x362);
    ::std::operator<<(poVar4," ");
    local_250 = uVar7;
    ::std::__cxx11::string::string
              ((string *)local_1e8,
               "`times` in TimeSamples must be type `double[]`, but got type `{}`",&local_281);
    linb::any::type_name_abi_cxx11_(&local_1c8,(any *)&local_200);
    fmt::format<std::__cxx11::string>
              ((string *)&local_228,(fmt *)local_1e8,(string *)&local_1c8,args);
    poVar4 = ::std::operator<<((ostream *)local_1a8,(string *)&local_228);
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    uVar7 = local_250;
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  nonstd::optional_lite::optional<std::vector<double,_std::allocator<double>_>_>::~optional
            ((optional<std::vector<double,_std::allocator<double>_>_> *)local_278);
  if (bVar3 != false) {
    pSVar1 = this->_sr;
    if (pSVar1->length_ < uVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar4 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,"[Crate]");
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ReadTimeSamples");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x36b);
      ::std::operator<<(poVar4," ");
      pcVar6 = "Failed to seek to TimeSamples values.";
LAB_0016fa94:
      poVar4 = ::std::operator<<((ostream *)local_1a8,pcVar6);
      ::std::operator<<(poVar4,"\n");
    }
    else {
      pSVar1->idx_ = uVar7;
      bVar3 = StreamReader::read8(pSVar1,&local_280);
      if (!bVar3) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar4 = ::std::operator<<((ostream *)local_1a8,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,"[Crate]");
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReadTimeSamples");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x371);
        ::std::operator<<(poVar4," ");
        pcVar6 = "Failed to read the offset for value in TimeSamples.";
        goto LAB_0016fa94;
      }
      pSVar1 = this->_sr;
      uVar5 = (local_280 + pSVar1->idx_) - 8;
      if ((-1 < (long)uVar5) && (uVar5 <= pSVar1->length_)) {
        pSVar1->idx_ = uVar5;
        local_1e8[0] = 0;
        bVar3 = StreamReader::read8(pSVar1,local_1e8);
        if (bVar3) {
          if ((long)local_248._M_impl.super__Vector_impl_data._M_finish -
              (long)local_248._M_impl.super__Vector_impl_data._M_start >> 3 == local_1e8[0]) {
            local_258 = (string *)&this->_err;
            uVar5 = 0;
            local_250 = uVar7;
            do {
              if (local_1e8[0] <= uVar5) {
                pSVar1 = this->_sr;
                if (pSVar1->length_ < local_250) {
                  uVar7 = pSVar1->idx_;
                }
                else {
                  pSVar1->idx_ = local_250;
                  uVar7 = local_250;
                }
                uVar5 = local_1e8[0] * 8 + uVar7;
                if (uVar5 <= pSVar1->length_ && -1 < (long)uVar5) {
                  pSVar1->idx_ = uVar5;
                  bVar3 = true;
                  goto LAB_0016fae4;
                }
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                poVar4 = ::std::operator<<((ostream *)local_1a8,"[error]");
                poVar4 = ::std::operator<<(poVar4,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar4 = ::std::operator<<(poVar4,"[Crate]");
                poVar4 = ::std::operator<<(poVar4,":");
                poVar4 = ::std::operator<<(poVar4,"ReadTimeSamples");
                poVar4 = ::std::operator<<(poVar4,"():");
                poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x3a5);
                ::std::operator<<(poVar4," ");
                pcVar6 = "Failed to seek over TimeSamples\'s values.";
LAB_0016fe77:
                poVar4 = ::std::operator<<((ostream *)local_1a8,pcVar6);
                ::std::operator<<(poVar4,"\n");
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::append(local_258);
                ::std::__cxx11::string::_M_dispose();
                goto LAB_0016fadd;
              }
              bVar3 = ReadValueRep(this,(ValueRep *)&local_1c8);
              if (!bVar3) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                poVar4 = ::std::operator<<((ostream *)local_1a8,"[error]");
                poVar4 = ::std::operator<<(poVar4,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar4 = ::std::operator<<(poVar4,"[Crate]");
                poVar4 = ::std::operator<<(poVar4,":");
                poVar4 = ::std::operator<<(poVar4,"ReadTimeSamples");
                poVar4 = ::std::operator<<(poVar4,"():");
                poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x38d);
                ::std::operator<<(poVar4," ");
                pcVar6 = "Failed to read ValueRep for TimeSample\' value element.";
                goto LAB_0016fe77;
              }
              uVar2 = this->_sr->idx_;
              local_218 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
              local_228.dynamic = (void *)0x0;
              bVar3 = UnpackValueRep(this,(ValueRep *)&local_1c8,(CrateValue *)&local_228);
              if (bVar3) {
                tinyusdz::value::TimeSamples::add_sample
                          (d,local_248._M_impl.super__Vector_impl_data._M_start[uVar5],
                           (Value *)&local_228);
                if (uVar2 <= this->_sr->length_) {
                  this->_sr->idx_ = uVar2;
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                poVar4 = ::std::operator<<((ostream *)local_1a8,"[error]");
                poVar4 = ::std::operator<<(poVar4,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar4 = ::std::operator<<(poVar4,"[Crate]");
                poVar4 = ::std::operator<<(poVar4,":");
                poVar4 = ::std::operator<<(poVar4,"ReadTimeSamples");
                poVar4 = ::std::operator<<(poVar4,"():");
                poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x397);
                ::std::operator<<(poVar4," ");
                poVar4 = ::std::operator<<((ostream *)local_1a8,
                                           "Failed to unpack value of TimeSample\'s value element.")
                ;
                ::std::operator<<(poVar4,"\n");
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::append(local_258);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              }
              if (local_218 != (undefined **)0x0) {
                (*(code *)local_218[4])(&local_228);
              }
              uVar5 = uVar5 + 1;
            } while (bVar3);
            goto LAB_0016fae2;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          poVar4 = ::std::operator<<((ostream *)local_1a8,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,"[Crate]");
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReadTimeSamples");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x386);
          ::std::operator<<(poVar4," ");
          pcVar6 = "# of `times` elements and # of values in Crate differs.";
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          poVar4 = ::std::operator<<((ostream *)local_1a8,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,"[Crate]");
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReadTimeSamples");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x37f);
          ::std::operator<<(poVar4," ");
          pcVar6 = "Failed to read the number of values from TimeSamples.";
        }
        goto LAB_0016fa94;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar4 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,"[Crate]");
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ReadTimeSamples");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x37a);
      ::std::operator<<(poVar4," ");
      ::std::__cxx11::to_string((string *)&local_228,local_280);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_278,"Failed to seek to TimeSample values. Invalid offset value: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_228);
      poVar4 = ::std::operator<<((ostream *)local_1a8,(string *)local_278);
      ::std::operator<<(poVar4,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
LAB_0016fadd:
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
LAB_0016fae2:
  bVar3 = false;
LAB_0016fae4:
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_248);
LAB_0016faee:
  if (local_1f0 == (undefined **)0x0) {
    return bVar3;
  }
  (*(code *)local_1f0[4])(&local_200);
  return bVar3;
}

Assistant:

bool CrateReader::ReadTimeSamples(value::TimeSamples *d) {

  // Layout
  //
  // - `times`(double[])
  // - NumValueReps(int64)
  // - ArrayOfValueRep
  //

  // TODO(syoyo): Deferred loading of TimeSamples?(See USD's implementation for details)

  DCOUT("ReadTimeSamples: offt before tell = " << _sr->tell());

  // 8byte for the offset for recursive value. See RecursiveRead() in
  // https://github.com/PixarAnimationStudios/USD/blob/release/pxr/usd/usd/crateFile.cpp for details.
  int64_t offset{0};
  if (!_sr->read8(&offset)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the offset for value in Dictionary.");
    return false;
  }

  DCOUT("TimeSample times value offset = " << offset);
  DCOUT("TimeSample tell = " << _sr->tell());

  // -8 to compensate sizeof(offset)
  if (!_sr->seek_from_current(offset - 8)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to seek to TimeSample times. Invalid offset value: " +
            std::to_string(offset));
  }

  // TODO(syoyo): Deduplicate times?

  crate::ValueRep times_rep{0};
  if (!ReadValueRep(&times_rep)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read ValueRep for TimeSample' `times` element.");
  }

  // Save offset
  auto values_offset = _sr->tell();

  // TODO: Enable Check if  type `double[]`
#if 0
  if (times_rep.GetType() == crate::CrateDataTypeId::CRATE_DATA_TYPE_DOUBLE_VECTOR) {
    // ok
  } else if ((times_rep.GetType() == crate::CrateDataTypeId::CRATE_DATA_TYPE_DOUBOLE) && times_rep.IsArray()) {
    // ok
  } else {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("`times` value must be type `double[]`, but got type `{}`", times_rep.GetTypeName()));
  }
#endif

  crate::CrateValue times_value;
  if (!UnpackValueRep(times_rep, &times_value)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to unpack value of TimeSample's `times` element.");
  }

  // must be an array of double.
  DCOUT("TimeSample times:" << times_value.type_name());

  std::vector<double> times;
  if (auto pv = times_value.get_value<std::vector<double>>()) {
    times = pv.value();
    DCOUT("`times` = " << times);
  } else {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("`times` in TimeSamples must be type `double[]`, but got type `{}`", times_value.type_name()));
  }

  //
  // Parse values(elements) of TimeSamples.
  //

  // seek position will be changed in `_UnpackValueRep`, so revert it.
  if (!_sr->seek_set(values_offset)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to seek to TimeSamples values.");
  }

  // 8byte for the offset for recursive value. See RecursiveRead() in
  // crateFile.cpp for details.
  if (!_sr->read8(&offset)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the offset for value in TimeSamples.");
    return false;
  }

  DCOUT("TimeSample value offset = " << offset);
  DCOUT("TimeSample tell = " << _sr->tell());

  // -8 to compensate sizeof(offset)
  if (!_sr->seek_from_current(offset - 8)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to seek to TimeSample values. Invalid offset value: " + std::to_string(offset));
  }

  uint64_t num_values{0};
  if (!_sr->read8(&num_values)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of values from TimeSamples.");
    return false;
  }

  DCOUT("Number of values = " << num_values);

  if (times.size() != num_values) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "# of `times` elements and # of values in Crate differs.");
  }

  for (size_t i = 0; i < num_values; i++) {

    crate::ValueRep rep;
    if (!ReadValueRep(&rep)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read ValueRep for TimeSample' value element.");
    }

    auto next_vrep_loc = _sr->tell();

    ///
    /// Type check of the content of `value` will be done at ReconstructPrim() in usdc-reader.cc.
    ///
    crate::CrateValue value;
    if (!UnpackValueRep(rep, &value)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to unpack value of TimeSample's value element.");
    }

    d->add_sample(times[i], value.get_raw());

    // UnpackValueRep() will change StreamReader's read position.
    // Revert to next ValueRep location here.
    _sr->seek_set(next_vrep_loc);
  }

  // Move to next location.
  // sizeof(uint64) = sizeof(ValueRep)
  _sr->seek_set(values_offset);
  if (!_sr->seek_from_current(int64_t(sizeof(uint64_t) * num_values))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to seek over TimeSamples's values.");
  }


  return true;
}